

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

void splev_stack_push(splevstack *st,opvar *v)

{
  opvar **__src;
  opvar **__dest;
  long lVar1;
  long lVar2;
  
  if ((st != (splevstack *)0x0) && (st->stackdata != (opvar **)0x0)) {
    lVar1 = st->depth;
    lVar2 = st->depth_alloc;
    if (lVar1 < lVar2) {
      __dest = st->stackdata;
    }
    else {
      __dest = (opvar **)malloc(lVar2 * 8 + 0x400);
      __src = st->stackdata;
      memcpy(__dest,__src,lVar2 * 8);
      if (__src != (opvar **)0x0) {
        free(__src);
        lVar1 = st->depth;
        lVar2 = st->depth_alloc;
      }
      st->stackdata = __dest;
      st->depth_alloc = lVar2 + 0x80;
    }
    __dest[lVar1] = v;
    st->depth = lVar1 + 1;
    return;
  }
  panic("splev_stack_push: no stackdata allocated?");
}

Assistant:

static void splev_stack_push(struct splevstack *st, struct opvar *v)
{
	if (!st || !st->stackdata)
	    panic("splev_stack_push: no stackdata allocated?");

	if (st->depth >= st->depth_alloc) {
	    struct opvar **tmp = malloc((st->depth_alloc + SPLEV_STACK_RESERVE) *
				        sizeof(struct opvar *));
	    memcpy(tmp, st->stackdata, st->depth_alloc * sizeof(struct opvar *));
	    Free(st->stackdata);
	    st->stackdata = tmp;
	    st->depth_alloc += SPLEV_STACK_RESERVE;
	}

	st->stackdata[st->depth] = v;
	st->depth++;
}